

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  buffer<char> *pbVar11;
  int iVar12;
  result rVar13;
  size_t sVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  char cVar21;
  uint uVar22;
  long lVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  size_t __len;
  ulong uVar26;
  boundaries bVar27;
  int exp;
  fixed_handler handler;
  uint local_94;
  ulong local_90;
  ulong local_88;
  fixed_handler local_80;
  buffer<char> *local_68;
  double local_60;
  fp local_58;
  uint64_t local_48;
  ulong local_40;
  float_specs local_38;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                ,0x42e,"value is negative");
  }
  uVar18 = (ulong)(uint)precision;
  uVar20 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar20 == 0x200000000) {
      uVar20 = buf->capacity_;
      if (uVar20 < uVar18) {
        (**buf->_vptr_buffer)(buf,uVar18);
        uVar20 = buf->capacity_;
      }
      if (uVar18 <= uVar20) {
        uVar20 = uVar18;
      }
      buf->size_ = uVar20;
      memset(buf->ptr_,0x30,uVar18);
      return -precision;
    }
    sVar14 = buf->size_;
    uVar18 = sVar14 + 1;
    if (buf->capacity_ < uVar18) {
      (**buf->_vptr_buffer)(buf);
      sVar14 = buf->size_;
      uVar18 = sVar14 + 1;
    }
    buf->size_ = uVar18;
    buf->ptr_[sVar14] = '0';
    return 0;
  }
  uVar18 = (ulong)specs >> 0x20;
  if ((specs._4_4_ >> 0x13 & 1) == 0) {
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
    return iVar12;
  }
  local_94 = 0;
  if (precision < 0) {
    local_58.f = 0;
    local_58.e = 0;
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      local_60 = value;
      bVar27 = fp::assign_with_boundaries<double>(&local_58,value);
    }
    else {
      local_60 = value;
      bVar27 = fp::assign_float_with_boundaries<double>(&local_58,value);
    }
    if ((local_58.f >> 0x34 & 1) == 0) {
      lVar19 = 0x3f;
      if ((local_58.f & 0xfffffffffffff) != 0) {
        for (; (local_58.f & 0xfffffffffffff) >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      local_58.f = local_58.f << (~(byte)lVar19 + 0x35 & 0x3f);
      local_58.e = (local_58.e - ((uint)lVar19 ^ 0x3f)) + 0xb;
    }
    iVar12 = (int)((ulong)((long)(-0x32 - local_58.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar17 = iVar12 + 0x15b;
    uVar22 = iVar12 + 0x162;
    if (-1 < (int)uVar17) {
      uVar22 = uVar17;
    }
    uVar18 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar22 >> 3) * 8 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar18;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_58.f << 0xb;
    local_58.f = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
    iVar12 = local_58.e +
             *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar22 >> 3) * 2 + 2) + 0x35
    ;
    if (0x1c < local_58.e +
               *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar22 >> 3) * 2 + 2) +
               0x71U) {
      local_58.e = iVar12;
      __assert_fail("min_exp <= fp_value.e && fp_value.e <= -32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                    ,0x44e,
                    "int fmt::detail::format_float(T, int, float_specs, buffer<char> &) [T = double]"
                   );
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar18;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = bVar27.upper;
    lVar19 = SUB168(auVar3 * auVar7,8);
    lVar23 = -(SUB168(auVar3 * auVar7,0) >> 0x3f);
    uVar15 = lVar19 + lVar23 + 1;
    local_80.buf = buf->ptr_;
    local_80._16_8_ = uVar15 - local_58.f;
    bVar16 = -(char)iVar12;
    uVar24 = 1L << (bVar16 & 0x3f);
    uVar20 = uVar15 >> (bVar16 & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar18;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar27.lower;
    local_80.size = 0;
    uVar17 = (uint)uVar20;
    local_58.e = iVar12;
    if (uVar17 == 0) {
LAB_00112b5a:
      local_80.size = 0;
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                  ,0x32d,"");
    }
    local_88 = uVar24 - 1;
    local_94 = 1;
    if (((((9 < uVar17) && (local_94 = 2, 99 < uVar17)) && (local_94 = 3, 999 < uVar17)) &&
        ((local_94 = 4, 9999 < uVar17 && (local_94 = 5, 99999 < uVar17)))) &&
       ((local_94 = 6, 999999 < uVar17 &&
        ((local_94 = 7, 9999999 < uVar17 && (local_94 = 8, 99999999 < uVar17)))))) {
      local_94 = 10 - (uVar17 < 1000000000);
    }
    local_90 = (ulong)((uVar22 & 0xfffffff8) + 8);
    uVar25 = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar19 + lVar23 + 2
    ;
    uVar15 = uVar15 & local_88;
    local_68 = buf;
    do {
      uVar22 = local_94 - 1;
      switch((ulong)uVar22) {
      case 0:
        cVar21 = (char)uVar20;
        uVar20 = 0;
        goto LAB_001125dd;
      case 1:
        cVar21 = (char)((uVar20 & 0xffffffff) / 10);
        iVar12 = (int)((uVar20 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar21 = (char)((uVar20 & 0xffffffff) / 100);
        iVar12 = (int)((uVar20 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar21 = (char)((uVar20 & 0xffffffff) / 1000);
        iVar12 = (int)((uVar20 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar21 = (char)((uVar20 & 0xffffffff) / 10000);
        iVar12 = (int)((uVar20 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar18 = uVar20 >> 5 & 0x7ffffff;
        cVar21 = (char)(uVar18 / 0xc35);
        iVar12 = (int)(uVar18 / 0xc35) * 100000;
        break;
      case 6:
        cVar21 = (char)((uVar20 & 0xffffffff) / 1000000);
        iVar12 = (int)((uVar20 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar21 = (char)((uVar20 & 0xffffffff) / 10000000);
        iVar12 = (int)((uVar20 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar21 = (char)((uVar20 & 0xffffffff) / 100000000);
        iVar12 = (int)((uVar20 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar18 = (uVar20 >> 9 & 0x7fffff) * 0x44b83;
        cVar21 = (char)(uVar18 >> 0x27);
        iVar12 = (uint)(uVar18 >> 0x27) * 1000000000;
        break;
      default:
        goto switchD_001128cc_default;
      }
      uVar20 = (ulong)(uint)((int)uVar20 - iVar12);
LAB_001125dd:
      local_94 = uVar22;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_80,cVar21 + '0',
                          (&basic_data<void>::powers_of_10_64)[uVar22] << (bVar16 & 0x3f),
                          (uVar20 << (bVar16 & 0x3f)) + uVar15,uVar25,uVar22,true);
      uVar18 = local_88;
      if (rVar13 != more) goto LAB_00112682;
    } while (0 < (int)local_94);
    do {
      uVar20 = uVar15 * 10;
      uVar25 = uVar25 * 10;
      uVar15 = uVar20 & uVar18;
      local_94 = local_94 - 1;
      rVar13 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_80,
                          (char)(uVar20 >> (bVar16 & 0x3f)) + '0',uVar24,uVar15,uVar25,local_94,
                          false);
    } while (rVar13 == more);
LAB_00112682:
    pbVar11 = local_68;
    uVar18 = (ulong)(uint)local_80.size;
    if (rVar13 == error) {
      local_94 = local_94 + (local_80.size - (int)local_90) + 0x15b;
      fallback_format<double>(local_60,local_68,(int *)&local_94);
      return local_94;
    }
    if (local_80.size < 0) {
LAB_00112ba9:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/core.h"
                  ,0x13d,"negative value");
    }
    uVar20 = local_68->capacity_;
    if (uVar20 < uVar18) {
      (**local_68->_vptr_buffer)(local_68,uVar18);
      uVar20 = pbVar11->capacity_;
    }
    if (uVar20 < uVar18) {
      uVar18 = uVar20;
    }
    pbVar11->size_ = uVar18;
    iVar12 = (int)local_90;
LAB_00112b0d:
    iVar12 = (local_94 - iVar12) + 0x15c;
  }
  else {
    if ((uint)precision < 0x12) {
      uVar15 = (ulong)value & 0xfffffffffffff;
      if ((ulong)value >> 0x34 == 0) {
        lVar19 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        uVar15 = uVar15 << (~(byte)lVar19 + 0x35 & 0x3f);
        iVar12 = ((uint)lVar19 ^ 0xffffffc0) - 0x426;
      }
      else {
        uVar15 = uVar15 | 0x10000000000000;
        iVar12 = (uint)((ulong)value >> 0x34) - 0x433;
      }
      iVar10 = (int)((ulong)((long)(-0x32 - iVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar17 = iVar10 + 0x15b;
      uVar22 = iVar10 + 0x162;
      if (-1 < (int)uVar17) {
        uVar22 = uVar17;
      }
      local_90 = (ulong)(uVar22 & 0xfffffff8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar15 << 0xb;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar22 >> 3) * 8 + 8);
      uVar26 = SUB168(auVar5 * auVar9,8) - (SUB168(auVar5 * auVar9,0) >> 0x3f);
      bVar16 = -((char)*(undefined2 *)
                        (basic_data<void>::pow10_exponents + (long)((int)uVar22 >> 3) * 2 + 2) +
                (char)iVar12) - 0x35;
      local_80.buf = buf->ptr_;
      local_80.size = 0;
      local_48 = 1L << (bVar16 & 0x3f);
      local_80.fixed = uVar20 == 0x200000000;
      local_80.exp10 = 0x154 - (uVar22 & 0xfffffff8);
      uVar15 = uVar26 >> (bVar16 & 0x3f);
      uVar22 = (uint)uVar15;
      local_80.precision = precision;
      local_68 = buf;
      local_40 = uVar18;
      local_38 = specs;
      if (uVar22 == 0) goto LAB_00112b5a;
      if (uVar15 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                    ,0x32e,"");
      }
      local_94 = 1;
      if ((((9 < uVar22) && (local_94 = 2, 99 < uVar22)) && (local_94 = 3, 999 < uVar22)) &&
         (((local_94 = 4, 9999 < uVar22 && (local_94 = 5, 99999 < uVar22)) &&
          ((local_94 = 6, 999999 < uVar22 &&
           ((local_94 = 7, 9999999 < uVar22 && (local_94 = 8, 99999999 < uVar22)))))))) {
        local_94 = 10 - (uVar22 < 1000000000);
      }
      local_60 = value;
      rVar13 = fixed_handler::on_start
                         (&local_80,
                          (&basic_data<void>::powers_of_10_64)[local_94 - 1] << (bVar16 & 0x3f),
                          uVar26 / 10,10,(int *)&local_94);
      if (rVar13 == more) {
        local_88 = local_48 - 1;
        uVar26 = uVar26 & local_88;
        do {
          uVar22 = local_94 - 1;
          switch((ulong)uVar22) {
          case 0:
            cVar21 = (char)uVar15;
            uVar15 = 0;
            goto LAB_001129b0;
          case 1:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar21 = (char)((uVar15 & 0xffffffff) / 100);
            iVar12 = (int)((uVar15 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar21 = (char)((uVar15 & 0xffffffff) / 1000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar18 = uVar15 >> 5 & 0x7ffffff;
            cVar21 = (char)(uVar18 / 0xc35);
            iVar12 = (int)(uVar18 / 0xc35) * 100000;
            break;
          case 6:
            cVar21 = (char)((uVar15 & 0xffffffff) / 1000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar21 = (char)((uVar15 & 0xffffffff) / 100000000);
            iVar12 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar18 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
            cVar21 = (char)(uVar18 >> 0x27);
            iVar12 = (uint)(uVar18 >> 0x27) * 1000000000;
            break;
          default:
switchD_001128cc_default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/foundation/3rdparty/fmt/include/fmt/format-inl.h"
                        ,0x360,"invalid number of digits");
          }
          uVar15 = (ulong)(uint)((int)uVar15 - iVar12);
LAB_001129b0:
          local_94 = uVar22;
          rVar13 = fixed_handler::on_digit
                             (&local_80,cVar21 + '0',
                              (&basic_data<void>::powers_of_10_64)[uVar22] << (bVar16 & 0x3f),
                              (uVar15 << (bVar16 & 0x3f)) + uVar26,1,uVar22,true);
          uVar24 = local_48;
          if (rVar13 != more) goto LAB_00112a5c;
        } while (0 < (int)local_94);
        uVar25 = 1;
        do {
          uVar18 = uVar26 * 10;
          uVar25 = uVar25 * 10;
          uVar26 = uVar18 & local_88;
          local_94 = local_94 - 1;
          rVar13 = fixed_handler::on_digit
                             (&local_80,(char)(uVar18 >> (bVar16 & 0x3f)) + '0',uVar24,uVar26,uVar25
                              ,local_94,false);
        } while (rVar13 == more);
      }
LAB_00112a5c:
      pbVar11 = local_68;
      buf = local_68;
      specs = local_38;
      value = local_60;
      if (rVar13 != error) {
        uVar18 = (ulong)(uint)local_80.size;
        if ((uVar20 == 0x200000000) || (local_80.size < 1 || ((uint)local_40 >> 0x14 & 1) != 0)) {
          if (local_80.size < 0) goto LAB_00112ba9;
        }
        else {
          do {
            uVar22 = local_94 + 1;
            if (local_68->ptr_[uVar18 - 1] != '0') goto LAB_00112ae4;
            bVar1 = 1 < uVar18;
            uVar18 = uVar18 - 1;
            local_94 = uVar22;
          } while (bVar1);
          uVar18 = 0;
        }
LAB_00112ae4:
        iVar12 = (int)local_90;
        uVar18 = uVar18 & 0xffffffff;
        uVar20 = local_68->capacity_;
        if (uVar20 < uVar18) {
          (**local_68->_vptr_buffer)(local_68,uVar18);
          uVar20 = pbVar11->capacity_;
        }
        iVar12 = iVar12 + 8;
        if (uVar20 < uVar18) {
          uVar18 = uVar20;
        }
        pbVar11->size_ = uVar18;
        goto LAB_00112b0d;
      }
    }
    iVar12 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar12;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision < 0) {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.try_resize(to_unsigned(handler.size));
  } else {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed && !specs.showpoint) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.try_resize(to_unsigned(num_digits));
  }
  return exp - cached_exp10;
}